

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O0

void signal_handler(int sig)

{
  ostream *this;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  int sig_local;
  
  g_Terminate = true;
  guard._M_device._4_4_ = sig;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&g_ReportMutex);
  this = std::operator<<((ostream *)&std::cout,"SIGINT received, terminating");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void signal_handler(int sig)
{
	(void)sig;

	g_Terminate = true;

	lock_guard<mutex> guard(g_ReportMutex);
	cout << "SIGINT received, terminating" << endl;
}